

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int combined_flags;
  int f2;
  int f1;
  CollSeq *pColl_local;
  Mem *pMem2_local;
  Mem *pMem1_local;
  
  uVar1 = pMem1->flags;
  uVar2 = pMem2->flags;
  uVar3 = uVar1 | uVar2;
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 0xc) == 0) {
      if ((uVar3 & 2) != 0) {
        if ((uVar1 & 2) == 0) {
          return 1;
        }
        if ((uVar2 & 2) == 0) {
          return -1;
        }
        if (pColl != (CollSeq *)0x0) {
          iVar4 = vdbeCompareMemString(pMem1,pMem2,pColl,(u8 *)0x0);
          return iVar4;
        }
      }
      pMem1_local._4_4_ = sqlite3BlobCompare(pMem1,pMem2);
    }
    else if ((uVar1 & uVar2 & 4) == 0) {
      if ((uVar1 & uVar2 & 8) == 0) {
        if ((uVar1 & 4) == 0) {
          if ((uVar1 & 8) == 0) {
            pMem1_local._4_4_ = 1;
          }
          else if ((uVar2 & 4) == 0) {
            pMem1_local._4_4_ = -1;
          }
          else {
            iVar4 = sqlite3IntFloatCompare((pMem2->u).i,(pMem1->u).r);
            pMem1_local._4_4_ = -iVar4;
          }
        }
        else if ((uVar2 & 8) == 0) {
          pMem1_local._4_4_ = -1;
        }
        else {
          pMem1_local._4_4_ = sqlite3IntFloatCompare((pMem1->u).i,(pMem2->u).r);
        }
      }
      else if ((pMem2->u).r <= (pMem1->u).r) {
        if ((pMem1->u).r < (pMem2->u).r || (pMem1->u).r == (pMem2->u).r) {
          pMem1_local._4_4_ = 0;
        }
        else {
          pMem1_local._4_4_ = 1;
        }
      }
      else {
        pMem1_local._4_4_ = -1;
      }
    }
    else if ((pMem1->u).i < (pMem2->u).i) {
      pMem1_local._4_4_ = -1;
    }
    else if ((pMem2->u).i < (pMem1->u).i) {
      pMem1_local._4_4_ = 1;
    }
    else {
      pMem1_local._4_4_ = 0;
    }
  }
  else {
    pMem1_local._4_4_ = (uVar2 & 1) - (uVar1 & 1);
  }
  return pMem1_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( (combined_flags & MEM_RowSet)==0 );
 
  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* At least one of the two values is a number
  */
  if( combined_flags&(MEM_Int|MEM_Real) ){
    if( (f1 & f2 & MEM_Int)!=0 ){
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return +1;
      return 0;
    }
    if( (f1 & f2 & MEM_Real)!=0 ){
      if( pMem1->u.r < pMem2->u.r ) return -1;
      if( pMem1->u.r > pMem2->u.r ) return +1;
      return 0;
    }
    if( (f1&MEM_Int)!=0 ){
      if( (f2&MEM_Real)!=0 ){
        return sqlite3IntFloatCompare(pMem1->u.i, pMem2->u.r);
      }else{
        return -1;
      }
    }
    if( (f1&MEM_Real)!=0 ){
      if( (f2&MEM_Int)!=0 ){
        return -sqlite3IntFloatCompare(pMem2->u.i, pMem1->u.r);
      }else{
        return -1;
      }
    }
    return +1;
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc || pMem1->db->mallocFailed );
    assert( pMem1->enc==SQLITE_UTF8 || 
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      return vdbeCompareMemString(pMem1, pMem2, pColl, 0);
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }
 
  /* Both values must be blobs.  Compare using memcmp().  */
  return sqlite3BlobCompare(pMem1, pMem2);
}